

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaProcessXSIType
              (xmlSchemaValidCtxtPtr vctxt,xmlSchemaAttrInfoPtr iattr,xmlSchemaTypePtr *localType,
              xmlSchemaElementPtr elemDecl)

{
  xmlSchemaAttrInfoPtr pxVar1;
  int iVar2;
  xmlSchemaTypePtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *local_60;
  xmlChar *str_1;
  xmlChar *pxStack_50;
  int set;
  xmlChar *str;
  xmlChar *local;
  xmlChar *nsName;
  xmlSchemaElementPtr pxStack_30;
  int ret;
  xmlSchemaElementPtr elemDecl_local;
  xmlSchemaTypePtr *localType_local;
  xmlSchemaAttrInfoPtr iattr_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  nsName._4_4_ = 0;
  if (localType == (xmlSchemaTypePtr *)0x0) {
    vctxt_local._4_4_ = -1;
  }
  else {
    *localType = (xmlSchemaTypePtr)0x0;
    if (iattr == (xmlSchemaAttrInfoPtr)0x0) {
      vctxt_local._4_4_ = 0;
    }
    else {
      local = (xmlChar *)0x0;
      str = (xmlChar *)0x0;
      vctxt->inode = (xmlSchemaNodeInfoPtr)iattr;
      pxStack_30 = elemDecl;
      elemDecl_local = (xmlSchemaElementPtr)localType;
      localType_local = (xmlSchemaTypePtr *)iattr;
      iattr_local = (xmlSchemaAttrInfoPtr)vctxt;
      nsName._4_4_ = xmlSchemaVExpandQName(vctxt,iattr->value,&local,&str);
      if (nsName._4_4_ == 0) {
        pxVar3 = xmlSchemaGetType((xmlSchemaPtr)iattr_local->value,str,local);
        pxVar1 = iattr_local;
        *(xmlSchemaTypePtr *)elemDecl_local = pxVar3;
        if (*(long *)elemDecl_local == 0) {
          pxStack_50 = (xmlChar *)0x0;
          pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
          pxVar4 = xmlSchemaFormatQName(&stack0xffffffffffffffb0,local,str);
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar1,XML_SCHEMAV_CVC_ELT_4_2,
                             (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar3,
                             "The QName value \'%s\' of the xsi:type attribute does not resolve to a type definition"
                             ,pxVar4,(xmlChar *)0x0);
          if (pxStack_50 != (xmlChar *)0x0) {
            (*xmlFree)(pxStack_50);
          }
          nsName._4_4_ = *(int *)&iattr_local->parent;
        }
        else if (pxStack_30 != (xmlSchemaElementPtr)0x0) {
          str_1._4_4_ = 0;
          if (((pxStack_30->flags & 0x800U) != 0) || ((pxStack_30->subtypes->flags & 0x40000U) != 0)
             ) {
            str_1._4_4_ = 2;
          }
          if (((pxStack_30->flags & 0x1000U) != 0) ||
             ((pxStack_30->subtypes->flags & 0x80000U) != 0)) {
            str_1._4_4_ = str_1._4_4_ | 1;
          }
          iVar2 = xmlSchemaCheckCOSDerivedOK
                            ((xmlSchemaAbstractCtxtPtr)iattr_local,
                             *(xmlSchemaTypePtr *)elemDecl_local,pxStack_30->subtypes,str_1._4_4_);
          pxVar1 = iattr_local;
          if (iVar2 != 0) {
            local_60 = (xmlChar *)0x0;
            pxVar4 = xmlSchemaFormatQName
                               (&local_60,*(xmlChar **)(*(long *)elemDecl_local + 0xd0),
                                *(xmlChar **)(*(long *)elemDecl_local + 0x10));
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar1,XML_SCHEMAV_CVC_ELT_4_3,
                               (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                               "The type definition \'%s\', specified by xsi:type, is blocked or not validly derived from the type definition of the element declaration"
                               ,pxVar4,(xmlChar *)0x0);
            if (local_60 != (xmlChar *)0x0) {
              (*xmlFree)(local_60);
            }
            nsName._4_4_ = *(int *)&iattr_local->parent;
            *(undefined8 *)elemDecl_local = 0;
          }
        }
      }
      else if (nsName._4_4_ < 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)iattr_local,"xmlSchemaValidateElementByDeclaration",
                   "calling xmlSchemaQNameExpand() to validate the attribute \'xsi:type\'");
        iattr_local[1].use =
             *(xmlSchemaAttributeUsePtr_conflict *)
              (*(long *)&iattr_local[1].flags +
              (long)*(int *)((long)&iattr_local[1].typeDef + 4) * 8);
        return -1;
      }
      iattr_local[1].use =
           *(xmlSchemaAttributeUsePtr_conflict *)
            (*(long *)&iattr_local[1].flags + (long)*(int *)((long)&iattr_local[1].typeDef + 4) * 8)
      ;
      vctxt_local._4_4_ = nsName._4_4_;
    }
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaProcessXSIType(xmlSchemaValidCtxtPtr vctxt,
			xmlSchemaAttrInfoPtr iattr,
			xmlSchemaTypePtr *localType,
			xmlSchemaElementPtr elemDecl)
{
    int ret = 0;
    /*
    * cvc-elt (3.3.4) : (4)
    * AND
    * Schema-Validity Assessment (Element) (cvc-assess-elt)
    *   (1.2.1.2.1) - (1.2.1.2.4)
    * Handle 'xsi:type'.
    */
    if (localType == NULL)
	return (-1);
    *localType = NULL;
    if (iattr == NULL)
	return (0);
    else {
	const xmlChar *nsName = NULL, *local = NULL;
	/*
	* TODO: We should report a *warning* that the type was overridden
	* by the instance.
	*/
	ACTIVATE_ATTRIBUTE(iattr);
	/*
	* (cvc-elt) (3.3.4) : (4.1)
	* (cvc-assess-elt) (1.2.1.2.2)
	*/
	ret = xmlSchemaVExpandQName(vctxt, iattr->value,
	    &nsName, &local);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElementByDeclaration",
		    "calling xmlSchemaQNameExpand() to validate the "
		    "attribute 'xsi:type'");
		goto internal_error;
	    }
	    goto exit;
	}
	/*
	* (cvc-elt) (3.3.4) : (4.2)
	* (cvc-assess-elt) (1.2.1.2.3)
	*/
	*localType = xmlSchemaGetType(vctxt->schema, local, nsName);
	if (*localType == NULL) {
	    xmlChar *str = NULL;

	    xmlSchemaCustomErr(ACTXT_CAST vctxt,
		XML_SCHEMAV_CVC_ELT_4_2, NULL,
		WXS_BASIC_CAST xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME),
		"The QName value '%s' of the xsi:type attribute does not "
		"resolve to a type definition",
		xmlSchemaFormatQName(&str, nsName, local), NULL);
	    FREE_AND_NULL(str);
	    ret = vctxt->err;
	    goto exit;
	}
	if (elemDecl != NULL) {
	    int set = 0;

	    /*
	    * SPEC cvc-elt (3.3.4) : (4.3) (Type Derivation OK)
	    * "The `local type definition` must be validly
	    * derived from the {type definition} given the union of
	    * the {disallowed substitutions} and the {type definition}'s
	    * {prohibited substitutions}, as defined in
	    * Type Derivation OK (Complex) ($3.4.6)
	    * (if it is a complex type definition),
	    * or given {disallowed substitutions} as defined in Type
	    * Derivation OK (Simple) ($3.14.6) (if it is a simple type
	    * definition)."
	    *
	    * {disallowed substitutions}: the "block" on the element decl.
	    * {prohibited substitutions}: the "block" on the type def.
	    */
	    /*
	    * OPTIMIZE TODO: We could map types already evaluated
	    * to be validly derived from other types to avoid checking
	    * this over and over for the same types.
	    */
	    if ((elemDecl->flags & XML_SCHEMAS_ELEM_BLOCK_EXTENSION) ||
		(elemDecl->subtypes->flags &
		    XML_SCHEMAS_TYPE_BLOCK_EXTENSION))
		set |= SUBSET_EXTENSION;

	    if ((elemDecl->flags & XML_SCHEMAS_ELEM_BLOCK_RESTRICTION) ||
		(elemDecl->subtypes->flags &
		    XML_SCHEMAS_TYPE_BLOCK_RESTRICTION))
		set |= SUBSET_RESTRICTION;

	    /*
	    * REMOVED and CHANGED since this produced a parser context
	    * which adds to the string dict of the schema. So this would
	    * change the schema and we don't want this. We don't need
	    * the parser context anymore.
	    *
	    * if ((vctxt->pctxt == NULL) &&
	    *	(xmlSchemaCreatePCtxtOnVCtxt(vctxt) == -1))
	    *	    return (-1);
	    */

	    if (xmlSchemaCheckCOSDerivedOK(ACTXT_CAST vctxt, *localType,
		elemDecl->subtypes, set) != 0) {
		xmlChar *str = NULL;

		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_ELT_4_3, NULL, NULL,
		    "The type definition '%s', specified by xsi:type, is "
		    "blocked or not validly derived from the type definition "
		    "of the element declaration",
		    xmlSchemaFormatQName(&str,
			(*localType)->targetNamespace,
			(*localType)->name),
		    NULL);
		FREE_AND_NULL(str);
		ret = vctxt->err;
		*localType = NULL;
	    }
	}
    }
exit:
    ACTIVATE_ELEM;
    return (ret);
internal_error:
    ACTIVATE_ELEM;
    return (-1);
}